

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_lazy.c
# Opt level: O1

size_t ZSTD_compressBlock_lazy_extDict
                 (ZSTD_matchState_t *ms,seqStore_t *seqStore,U32 *rep,void *src,size_t srcSize)

{
  ulong *puVar1;
  ulong *puVar2;
  ulong *puVar3;
  ulong *puVar4;
  ulong *iEnd;
  undefined8 *puVar5;
  ulong *puVar6;
  byte bVar7;
  uint uVar8;
  uint uVar9;
  U32 UVar10;
  int iVar11;
  BYTE *pBVar12;
  BYTE *pBVar13;
  U32 *pUVar14;
  U32 *pUVar15;
  seqDef *psVar16;
  bool bVar17;
  undefined8 uVar18;
  char cVar19;
  int iVar20;
  BYTE *pBVar21;
  size_t sVar22;
  BYTE *pBVar23;
  BYTE *pBVar24;
  ulong uVar25;
  U32 UVar26;
  BYTE *iStart;
  ulong *puVar27;
  ulong *puVar28;
  BYTE *pBVar29;
  BYTE *pBVar30;
  ulong *puVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  ulong *puVar35;
  ulong *puVar36;
  long lVar37;
  uint uVar38;
  U32 UVar39;
  ulong uVar40;
  ulong uVar41;
  int iVar42;
  uint uVar43;
  uint uVar44;
  ulong uVar45;
  U32 UVar46;
  BYTE *base;
  BYTE *litEnd;
  int iVar47;
  U32 UVar48;
  U32 maxDistance;
  BYTE *litLimit_w;
  ulong *local_148;
  ulong local_130;
  BYTE *local_118;
  ulong local_100;
  
  iEnd = (ulong *)((long)src + srcSize);
  puVar6 = (ulong *)((long)src + (srcSize - 8));
  pBVar12 = (ms->window).base;
  uVar8 = (ms->window).dictLimit;
  iStart = pBVar12 + uVar8;
  UVar46 = *rep;
  UVar39 = rep[1];
  local_148 = (ulong *)((ulong)(iStart == (BYTE *)src) + (long)src);
  if (local_148 < puVar6) {
    pBVar13 = (ms->window).dictBase;
    puVar27 = (ulong *)(pBVar13 + uVar8);
    uVar9 = (ms->window).lowLimit;
    uVar32 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
    iVar20 = uVar8 - 1;
    puVar1 = (ulong *)((long)iEnd - 7);
    puVar2 = (ulong *)((long)iEnd - 3);
    puVar3 = (ulong *)((long)iEnd - 1);
    puVar4 = iEnd + -4;
    do {
      iVar47 = (int)local_148 - (int)pBVar12;
      iVar42 = iVar47 + 1;
      UVar10 = (ms->window).lowLimit;
      UVar48 = ms->loadedDictEnd;
      UVar26 = iVar42 - uVar32;
      if (iVar42 - UVar10 <= uVar32) {
        UVar26 = UVar10;
      }
      if (UVar48 != 0) {
        UVar26 = UVar10;
      }
      uVar43 = iVar42 - UVar46;
      pBVar29 = pBVar12;
      if (uVar43 < uVar8) {
        pBVar29 = pBVar13;
      }
      if (iVar20 - uVar43 < 3) {
LAB_001fb8b8:
        pBVar21 = (BYTE *)0x0;
      }
      else {
        pBVar21 = (BYTE *)0x0;
        if (UVar46 < (iVar47 - UVar26) + 1) {
          if (*(int *)((long)local_148 + 1U) != *(int *)(pBVar29 + uVar43)) goto LAB_001fb8b8;
          puVar35 = iEnd;
          if (uVar43 < uVar8) {
            puVar35 = puVar27;
          }
          sVar22 = ZSTD_count_2segments
                             ((BYTE *)((long)local_148 + 5),(BYTE *)((long)(pBVar29 + uVar43) + 4),
                              (BYTE *)iEnd,(BYTE *)puVar35,iStart);
          pBVar21 = (BYTE *)(sVar22 + 4);
        }
      }
      uVar43 = (ms->cParams).minMatch;
      if (uVar43 - 6 < 2) {
        bVar7 = (byte)(ms->cParams).chainLog;
        uVar38 = 1 << (bVar7 & 0x1f);
        pBVar29 = (ms->window).base;
        pBVar30 = (ms->window).dictBase;
        uVar33 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar43 = (uint)((long)local_148 - (long)pBVar29);
        UVar26 = uVar43 - uVar33;
        if (uVar43 - UVar10 <= uVar33) {
          UVar26 = UVar10;
        }
        uVar33 = (ms->window).dictLimit;
        if (UVar48 != 0) {
          UVar26 = UVar10;
        }
        uVar34 = uVar43 - uVar38;
        if (uVar43 < uVar38) {
          uVar34 = 0;
        }
        pUVar14 = ms->chainTable;
        iVar42 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        pUVar15 = ms->hashTable;
        uVar40 = (ulong)ms->nextToUpdate;
        cVar19 = (char)(ms->cParams).hashLog;
        if (ms->nextToUpdate < uVar43) {
          do {
            uVar45 = (ulong)(*(long *)(pBVar29 + uVar40) * -0x30e4432340650000) >>
                     (0x40U - cVar19 & 0x3f);
            pUVar14[(uint)uVar40 & ~(-1 << (bVar7 & 0x1f))] = pUVar15[uVar45];
            pUVar15[uVar45] = (uint)uVar40;
            uVar40 = uVar40 + 1;
          } while (uVar40 < ((long)local_148 - (long)pBVar29 & 0xffffffffU));
        }
        ms->nextToUpdate = uVar43;
        uVar40 = *local_148;
        uVar44 = pUVar15[uVar40 * -0x30e4432340650000 >> (-cVar19 & 0x3fU)];
        if (uVar44 < UVar26) goto LAB_001fbf71;
        local_100 = 999999999;
        pBVar24 = (BYTE *)0x3;
        do {
          if (uVar44 < uVar33) {
            if (*(int *)(pBVar30 + uVar44) == (int)*local_148) {
              sVar22 = ZSTD_count_2segments
                                 ((BYTE *)((long)local_148 + 4),pBVar30 + (ulong)uVar44 + 4,
                                  (BYTE *)iEnd,pBVar30 + uVar33,pBVar29 + uVar33);
              pBVar23 = (BYTE *)(sVar22 + 4);
            }
            else {
LAB_001fbb08:
              pBVar23 = (BYTE *)0x0;
            }
          }
          else {
            puVar35 = (ulong *)(pBVar29 + uVar44);
            if (pBVar24[(long)puVar35] != *(BYTE *)((long)local_148 + (long)pBVar24))
            goto LAB_001fbb08;
            puVar31 = local_148;
            if (local_148 < puVar1) {
              uVar25 = *puVar35 ^ uVar40;
              uVar45 = 0;
              if (uVar25 != 0) {
                for (; (uVar25 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                }
              }
              pBVar23 = (BYTE *)(uVar45 >> 3 & 0x1fffffff);
              if (*puVar35 == uVar40) {
                do {
                  puVar31 = puVar31 + 1;
                  puVar35 = puVar35 + 1;
                  if (puVar1 <= puVar31) goto LAB_001fbb0f;
                  uVar25 = *puVar31 ^ *puVar35;
                  uVar45 = 0;
                  if (uVar25 != 0) {
                    for (; (uVar25 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                    }
                  }
                  pBVar23 = (BYTE *)((long)puVar31 + ((uVar45 >> 3 & 0x1fffffff) - (long)local_148))
                  ;
                } while (*puVar35 == *puVar31);
              }
            }
            else {
LAB_001fbb0f:
              if ((puVar31 < puVar2) && ((int)*puVar35 == (int)*puVar31)) {
                puVar31 = (ulong *)((long)puVar31 + 4);
                puVar35 = (ulong *)((long)puVar35 + 4);
              }
              if ((puVar31 < puVar3) && ((short)*puVar35 == (short)*puVar31)) {
                puVar31 = (ulong *)((long)puVar31 + 2);
                puVar35 = (ulong *)((long)puVar35 + 2);
              }
              if (puVar31 < iEnd) {
                puVar31 = (ulong *)((long)puVar31 + (ulong)((BYTE)*puVar35 == (BYTE)*puVar31));
              }
              pBVar23 = (BYTE *)((long)puVar31 - (long)local_148);
            }
          }
          if ((pBVar24 < pBVar23) &&
             (local_100 = (ulong)((uVar43 + 2) - uVar44), pBVar24 = pBVar23,
             (ulong *)((long)local_148 + (long)pBVar23) == iEnd)) {
            bVar17 = false;
          }
          else {
            pBVar23 = pBVar24;
            if (uVar34 < uVar44) {
              uVar44 = pUVar14[uVar44 & uVar38 - 1];
              bVar17 = true;
            }
            else {
              bVar17 = false;
            }
          }
        } while (((bVar17) && (UVar26 <= uVar44)) &&
                (iVar42 = iVar42 + -1, pBVar24 = pBVar23, iVar42 != 0));
      }
      else if (uVar43 == 5) {
        bVar7 = (byte)(ms->cParams).chainLog;
        uVar38 = 1 << (bVar7 & 0x1f);
        pBVar29 = (ms->window).base;
        pBVar30 = (ms->window).dictBase;
        uVar33 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar43 = (uint)((long)local_148 - (long)pBVar29);
        UVar26 = uVar43 - uVar33;
        if (uVar43 - UVar10 <= uVar33) {
          UVar26 = UVar10;
        }
        uVar33 = (ms->window).dictLimit;
        if (UVar48 != 0) {
          UVar26 = UVar10;
        }
        uVar34 = uVar43 - uVar38;
        if (uVar43 < uVar38) {
          uVar34 = 0;
        }
        pUVar14 = ms->chainTable;
        iVar42 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        pUVar15 = ms->hashTable;
        uVar40 = (ulong)ms->nextToUpdate;
        cVar19 = (char)(ms->cParams).hashLog;
        if (ms->nextToUpdate < uVar43) {
          do {
            uVar45 = (ulong)(*(long *)(pBVar29 + uVar40) * -0x30e4432345000000) >>
                     (0x40U - cVar19 & 0x3f);
            pUVar14[(uint)uVar40 & ~(-1 << (bVar7 & 0x1f))] = pUVar15[uVar45];
            pUVar15[uVar45] = (uint)uVar40;
            uVar40 = uVar40 + 1;
          } while (uVar40 < ((long)local_148 - (long)pBVar29 & 0xffffffffU));
        }
        ms->nextToUpdate = uVar43;
        uVar40 = *local_148;
        uVar44 = pUVar15[uVar40 * -0x30e4432345000000 >> (-cVar19 & 0x3fU)];
        if (uVar44 < UVar26) {
LAB_001fbf71:
          pBVar23 = (BYTE *)0x3;
          local_100 = 999999999;
        }
        else {
          local_100 = 999999999;
          pBVar24 = (BYTE *)0x3;
          do {
            if (uVar44 < uVar33) {
              if (*(int *)(pBVar30 + uVar44) == (int)*local_148) {
                sVar22 = ZSTD_count_2segments
                                   ((BYTE *)((long)local_148 + 4),pBVar30 + (ulong)uVar44 + 4,
                                    (BYTE *)iEnd,pBVar30 + uVar33,pBVar29 + uVar33);
                pBVar23 = (BYTE *)(sVar22 + 4);
              }
              else {
LAB_001fbdd6:
                pBVar23 = (BYTE *)0x0;
              }
            }
            else {
              puVar35 = (ulong *)(pBVar29 + uVar44);
              if (pBVar24[(long)puVar35] != *(BYTE *)((long)local_148 + (long)pBVar24))
              goto LAB_001fbdd6;
              puVar31 = local_148;
              if (local_148 < puVar1) {
                uVar25 = *puVar35 ^ uVar40;
                uVar45 = 0;
                if (uVar25 != 0) {
                  for (; (uVar25 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                  }
                }
                pBVar23 = (BYTE *)(uVar45 >> 3 & 0x1fffffff);
                if (*puVar35 == uVar40) {
                  do {
                    puVar31 = puVar31 + 1;
                    puVar35 = puVar35 + 1;
                    if (puVar1 <= puVar31) goto LAB_001fbddd;
                    uVar25 = *puVar31 ^ *puVar35;
                    uVar45 = 0;
                    if (uVar25 != 0) {
                      for (; (uVar25 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                      }
                    }
                    pBVar23 = (BYTE *)((long)puVar31 +
                                      ((uVar45 >> 3 & 0x1fffffff) - (long)local_148));
                  } while (*puVar35 == *puVar31);
                }
              }
              else {
LAB_001fbddd:
                if ((puVar31 < puVar2) && ((int)*puVar35 == (int)*puVar31)) {
                  puVar31 = (ulong *)((long)puVar31 + 4);
                  puVar35 = (ulong *)((long)puVar35 + 4);
                }
                if ((puVar31 < puVar3) && ((short)*puVar35 == (short)*puVar31)) {
                  puVar31 = (ulong *)((long)puVar31 + 2);
                  puVar35 = (ulong *)((long)puVar35 + 2);
                }
                if (puVar31 < iEnd) {
                  puVar31 = (ulong *)((long)puVar31 + (ulong)((BYTE)*puVar35 == (BYTE)*puVar31));
                }
                pBVar23 = (BYTE *)((long)puVar31 - (long)local_148);
              }
            }
            if ((pBVar24 < pBVar23) &&
               (local_100 = (ulong)((uVar43 + 2) - uVar44), pBVar24 = pBVar23,
               (ulong *)((long)local_148 + (long)pBVar23) == iEnd)) {
              bVar17 = false;
            }
            else {
              pBVar23 = pBVar24;
              if (uVar34 < uVar44) {
                uVar44 = pUVar14[uVar44 & uVar38 - 1];
                bVar17 = true;
              }
              else {
                bVar17 = false;
              }
            }
          } while (((bVar17) && (UVar26 <= uVar44)) &&
                  (iVar42 = iVar42 + -1, pBVar24 = pBVar23, iVar42 != 0));
        }
      }
      else {
        bVar7 = (byte)(ms->cParams).chainLog;
        uVar38 = 1 << (bVar7 & 0x1f);
        pBVar29 = (ms->window).base;
        pBVar30 = (ms->window).dictBase;
        uVar33 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
        uVar43 = (uint)((long)local_148 - (long)pBVar29);
        UVar26 = uVar43 - uVar33;
        if (uVar43 - UVar10 <= uVar33) {
          UVar26 = UVar10;
        }
        uVar33 = (ms->window).dictLimit;
        if (UVar48 != 0) {
          UVar26 = UVar10;
        }
        uVar34 = uVar43 - uVar38;
        if (uVar43 < uVar38) {
          uVar34 = 0;
        }
        pUVar14 = ms->chainTable;
        iVar42 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
        pUVar15 = ms->hashTable;
        uVar40 = (ulong)ms->nextToUpdate;
        cVar19 = (char)(ms->cParams).hashLog;
        if (ms->nextToUpdate < uVar43) {
          do {
            uVar44 = (uint)(*(int *)(pBVar29 + uVar40) * -0x61c8864f) >> (0x20U - cVar19 & 0x1f);
            pUVar14[(uint)uVar40 & ~(-1 << (bVar7 & 0x1f))] = pUVar15[uVar44];
            pUVar15[uVar44] = (uint)uVar40;
            uVar40 = uVar40 + 1;
          } while (uVar40 < ((long)local_148 - (long)pBVar29 & 0xffffffffU));
        }
        ms->nextToUpdate = uVar43;
        uVar40 = *local_148;
        uVar44 = pUVar15[(uint)((int)uVar40 * -0x61c8864f) >> (-cVar19 & 0x1fU)];
        if (uVar44 < UVar26) goto LAB_001fbf71;
        local_100 = 999999999;
        pBVar24 = (BYTE *)0x3;
        do {
          if (uVar44 < uVar33) {
            if (*(int *)(pBVar30 + uVar44) == (int)uVar40) {
              sVar22 = ZSTD_count_2segments
                                 ((BYTE *)((long)local_148 + 4),pBVar30 + (ulong)uVar44 + 4,
                                  (BYTE *)iEnd,pBVar30 + uVar33,pBVar29 + uVar33);
              pBVar23 = (BYTE *)(sVar22 + 4);
            }
            else {
LAB_001fcc2d:
              pBVar23 = (BYTE *)0x0;
            }
          }
          else {
            puVar35 = (ulong *)(pBVar29 + uVar44);
            if (pBVar24[(long)puVar35] != *(BYTE *)((long)local_148 + (long)pBVar24))
            goto LAB_001fcc2d;
            puVar31 = local_148;
            if (local_148 < puVar1) {
              uVar25 = *local_148 ^ *puVar35;
              uVar45 = 0;
              if (uVar25 != 0) {
                for (; (uVar25 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                }
              }
              pBVar23 = (BYTE *)(uVar45 >> 3 & 0x1fffffff);
              if (*puVar35 == *local_148) {
                do {
                  puVar31 = puVar31 + 1;
                  puVar35 = puVar35 + 1;
                  if (puVar1 <= puVar31) goto LAB_001fcc34;
                  uVar25 = *puVar31 ^ *puVar35;
                  uVar45 = 0;
                  if (uVar25 != 0) {
                    for (; (uVar25 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                    }
                  }
                  pBVar23 = (BYTE *)((long)puVar31 + ((uVar45 >> 3 & 0x1fffffff) - (long)local_148))
                  ;
                } while (*puVar35 == *puVar31);
              }
            }
            else {
LAB_001fcc34:
              if ((puVar31 < puVar2) && ((int)*puVar35 == (int)*puVar31)) {
                puVar31 = (ulong *)((long)puVar31 + 4);
                puVar35 = (ulong *)((long)puVar35 + 4);
              }
              if ((puVar31 < puVar3) && ((short)*puVar35 == (short)*puVar31)) {
                puVar31 = (ulong *)((long)puVar31 + 2);
                puVar35 = (ulong *)((long)puVar35 + 2);
              }
              if (puVar31 < iEnd) {
                puVar31 = (ulong *)((long)puVar31 + (ulong)((BYTE)*puVar35 == (BYTE)*puVar31));
              }
              pBVar23 = (BYTE *)((long)puVar31 - (long)local_148);
            }
          }
          if ((pBVar24 < pBVar23) &&
             (local_100 = (ulong)((uVar43 + 2) - uVar44), pBVar24 = pBVar23,
             (ulong *)((long)local_148 + (long)pBVar23) == iEnd)) {
            bVar17 = false;
          }
          else {
            pBVar23 = pBVar24;
            if (uVar34 < uVar44) {
              uVar44 = pUVar14[uVar44 & uVar38 - 1];
              bVar17 = true;
            }
            else {
              bVar17 = false;
            }
          }
        } while (((bVar17) && (UVar26 <= uVar44)) &&
                (iVar42 = iVar42 + -1, pBVar24 = pBVar23, iVar42 != 0));
      }
      local_118 = pBVar21;
      if (pBVar21 < pBVar23) {
        local_118 = pBVar23;
      }
      if (local_118 < (BYTE *)0x4) {
        local_148 = (ulong *)((long)local_148 + ((long)local_148 - (long)src >> 8) + 1);
      }
      else {
        puVar35 = local_148;
        if (pBVar23 <= pBVar21) {
          local_100 = 0;
          puVar35 = (ulong *)((long)local_148 + 1U);
        }
        do {
          if (puVar6 <= local_148) break;
          puVar31 = (ulong *)((long)local_148 + 1);
          iVar47 = iVar47 + 1;
          if (local_100 == 0) {
            local_100 = 0;
          }
          else {
            UVar10 = (ms->window).lowLimit;
            UVar48 = iVar47 - uVar32;
            if (iVar47 - UVar10 <= uVar32) {
              UVar48 = UVar10;
            }
            if (ms->loadedDictEnd != 0) {
              UVar48 = UVar10;
            }
            uVar43 = iVar47 - UVar46;
            pBVar29 = pBVar12;
            if (uVar43 < uVar8) {
              pBVar29 = pBVar13;
            }
            if (((2 < iVar20 - uVar43) && (UVar46 < iVar47 - UVar48)) &&
               (*(int *)puVar31 == *(int *)(pBVar29 + uVar43))) {
              puVar36 = iEnd;
              if (uVar43 < uVar8) {
                puVar36 = puVar27;
              }
              sVar22 = ZSTD_count_2segments
                                 ((BYTE *)((long)local_148 + 5),
                                  (BYTE *)((long)(pBVar29 + uVar43) + 4),(BYTE *)iEnd,
                                  (BYTE *)puVar36,iStart);
              if (sVar22 < 0xfffffffffffffffc) {
                uVar33 = (int)local_100 + 1;
                uVar43 = 0x1f;
                if (uVar33 != 0) {
                  for (; uVar33 >> uVar43 == 0; uVar43 = uVar43 - 1) {
                  }
                }
                if ((int)((uVar43 ^ 0x1f) + (int)local_118 * 3 + -0x1e) <
                    (int)(BYTE *)(sVar22 + 4) * 3) {
                  local_100 = 0;
                  puVar35 = puVar31;
                  local_118 = (BYTE *)(sVar22 + 4);
                }
              }
            }
          }
          uVar43 = (ms->cParams).minMatch;
          if (uVar43 - 6 < 2) {
            bVar7 = (byte)(ms->cParams).chainLog;
            uVar38 = 1 << (bVar7 & 0x1f);
            pUVar14 = ms->chainTable;
            pBVar29 = (ms->window).base;
            pBVar21 = (ms->window).dictBase;
            uVar33 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            UVar10 = (ms->window).lowLimit;
            uVar43 = (uint)((long)puVar31 - (long)pBVar29);
            UVar48 = uVar43 - uVar33;
            if (uVar43 - UVar10 <= uVar33) {
              UVar48 = UVar10;
            }
            if (ms->loadedDictEnd != 0) {
              UVar48 = UVar10;
            }
            uVar33 = uVar43 - uVar38;
            if (uVar43 < uVar38) {
              uVar33 = 0;
            }
            uVar34 = (ms->window).dictLimit;
            iVar42 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
            pUVar15 = ms->hashTable;
            uVar40 = (ulong)ms->nextToUpdate;
            cVar19 = (char)(ms->cParams).hashLog;
            if (ms->nextToUpdate < uVar43) {
              do {
                uVar45 = (ulong)(*(long *)(pBVar29 + uVar40) * -0x30e4432340650000) >>
                         (0x40U - cVar19 & 0x3f);
                pUVar14[(uint)uVar40 & ~(-1 << (bVar7 & 0x1f))] = pUVar15[uVar45];
                pUVar15[uVar45] = (uint)uVar40;
                uVar40 = uVar40 + 1;
              } while (uVar40 < ((long)puVar31 - (long)pBVar29 & 0xffffffffU));
            }
            ms->nextToUpdate = uVar43;
            uVar40 = *puVar31;
            uVar44 = pUVar15[uVar40 * -0x30e4432340650000 >> (-cVar19 & 0x3fU)];
            if (uVar44 < UVar48) goto LAB_001fc7b4;
            local_130 = 999999999;
            pBVar30 = (BYTE *)0x3;
            do {
              if (uVar44 < uVar34) {
                if (*(int *)(pBVar21 + uVar44) == *(int *)puVar31) {
                  sVar22 = ZSTD_count_2segments
                                     ((BYTE *)((long)local_148 + 5),pBVar21 + (ulong)uVar44 + 4,
                                      (BYTE *)iEnd,pBVar21 + uVar34,pBVar29 + uVar34);
                  pBVar24 = (BYTE *)(sVar22 + 4);
                }
                else {
LAB_001fc35c:
                  pBVar24 = (BYTE *)0x0;
                }
              }
              else {
                puVar36 = (ulong *)(pBVar29 + uVar44);
                if (pBVar30[(long)puVar36] != *(BYTE *)((long)puVar31 + (long)pBVar30))
                goto LAB_001fc35c;
                puVar28 = puVar31;
                if (puVar31 < puVar1) {
                  uVar25 = *puVar36 ^ uVar40;
                  uVar45 = 0;
                  if (uVar25 != 0) {
                    for (; (uVar25 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                    }
                  }
                  pBVar24 = (BYTE *)(uVar45 >> 3 & 0x1fffffff);
                  puVar28 = (ulong *)((long)local_148 + 9);
                  if (*puVar36 == uVar40) {
                    do {
                      puVar36 = puVar36 + 1;
                      if (puVar1 <= puVar28) goto LAB_001fc363;
                      uVar45 = *puVar28;
                      uVar41 = uVar45 ^ *puVar36;
                      uVar25 = 0;
                      if (uVar41 != 0) {
                        for (; (uVar41 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                        }
                      }
                      pBVar24 = (BYTE *)((long)puVar28 +
                                        ((uVar25 >> 3 & 0x1fffffff) - (long)puVar31));
                      puVar28 = puVar28 + 1;
                    } while (*puVar36 == uVar45);
                  }
                }
                else {
LAB_001fc363:
                  if ((puVar28 < puVar2) && ((int)*puVar36 == (int)*puVar28)) {
                    puVar28 = (ulong *)((long)puVar28 + 4);
                    puVar36 = (ulong *)((long)puVar36 + 4);
                  }
                  if ((puVar28 < puVar3) && ((short)*puVar36 == (short)*puVar28)) {
                    puVar28 = (ulong *)((long)puVar28 + 2);
                    puVar36 = (ulong *)((long)puVar36 + 2);
                  }
                  if (puVar28 < iEnd) {
                    puVar28 = (ulong *)((long)puVar28 + (ulong)((BYTE)*puVar36 == (BYTE)*puVar28));
                  }
                  pBVar24 = (BYTE *)((long)puVar28 - (long)puVar31);
                }
              }
              if ((pBVar30 < pBVar24) &&
                 (local_130 = (ulong)((uVar43 + 2) - uVar44), pBVar30 = pBVar24,
                 (ulong *)((long)puVar31 + (long)pBVar24) == iEnd)) {
                bVar17 = false;
              }
              else {
                pBVar24 = pBVar30;
                if (uVar33 < uVar44) {
                  uVar44 = pUVar14[uVar44 & uVar38 - 1];
                  bVar17 = true;
                }
                else {
                  bVar17 = false;
                }
              }
            } while (((bVar17) && (UVar48 <= uVar44)) &&
                    (iVar42 = iVar42 + -1, pBVar30 = pBVar24, iVar42 != 0));
          }
          else if (uVar43 == 5) {
            bVar7 = (byte)(ms->cParams).chainLog;
            uVar38 = 1 << (bVar7 & 0x1f);
            pUVar14 = ms->chainTable;
            pBVar29 = (ms->window).base;
            pBVar21 = (ms->window).dictBase;
            uVar33 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            UVar10 = (ms->window).lowLimit;
            uVar43 = (uint)((long)puVar31 - (long)pBVar29);
            UVar48 = uVar43 - uVar33;
            if (uVar43 - UVar10 <= uVar33) {
              UVar48 = UVar10;
            }
            if (ms->loadedDictEnd != 0) {
              UVar48 = UVar10;
            }
            uVar33 = uVar43 - uVar38;
            if (uVar43 < uVar38) {
              uVar33 = 0;
            }
            uVar34 = (ms->window).dictLimit;
            iVar42 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
            pUVar15 = ms->hashTable;
            uVar40 = (ulong)ms->nextToUpdate;
            cVar19 = (char)(ms->cParams).hashLog;
            if (ms->nextToUpdate < uVar43) {
              do {
                uVar45 = (ulong)(*(long *)(pBVar29 + uVar40) * -0x30e4432345000000) >>
                         (0x40U - cVar19 & 0x3f);
                pUVar14[(uint)uVar40 & ~(-1 << (bVar7 & 0x1f))] = pUVar15[uVar45];
                pUVar15[uVar45] = (uint)uVar40;
                uVar40 = uVar40 + 1;
              } while (uVar40 < ((long)puVar31 - (long)pBVar29 & 0xffffffffU));
            }
            ms->nextToUpdate = uVar43;
            uVar40 = *puVar31;
            uVar44 = pUVar15[uVar40 * -0x30e4432345000000 >> (-cVar19 & 0x3fU)];
            if (uVar44 < UVar48) {
LAB_001fc7b4:
              pBVar24 = (BYTE *)0x3;
              local_130 = 999999999;
            }
            else {
              local_130 = 999999999;
              pBVar30 = (BYTE *)0x3;
              do {
                if (uVar44 < uVar34) {
                  if (*(int *)(pBVar21 + uVar44) == *(int *)puVar31) {
                    sVar22 = ZSTD_count_2segments
                                       ((BYTE *)((long)local_148 + 5),pBVar21 + (ulong)uVar44 + 4,
                                        (BYTE *)iEnd,pBVar21 + uVar34,pBVar29 + uVar34);
                    pBVar24 = (BYTE *)(sVar22 + 4);
                  }
                  else {
LAB_001fc61e:
                    pBVar24 = (BYTE *)0x0;
                  }
                }
                else {
                  puVar36 = (ulong *)(pBVar29 + uVar44);
                  if (pBVar30[(long)puVar36] != *(BYTE *)((long)puVar31 + (long)pBVar30))
                  goto LAB_001fc61e;
                  puVar28 = puVar31;
                  if (puVar31 < puVar1) {
                    uVar25 = *puVar36 ^ uVar40;
                    uVar45 = 0;
                    if (uVar25 != 0) {
                      for (; (uVar25 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                      }
                    }
                    pBVar24 = (BYTE *)(uVar45 >> 3 & 0x1fffffff);
                    puVar28 = (ulong *)((long)local_148 + 9);
                    if (*puVar36 == uVar40) {
                      do {
                        puVar36 = puVar36 + 1;
                        if (puVar1 <= puVar28) goto LAB_001fc625;
                        uVar45 = *puVar28;
                        uVar41 = uVar45 ^ *puVar36;
                        uVar25 = 0;
                        if (uVar41 != 0) {
                          for (; (uVar41 >> uVar25 & 1) == 0; uVar25 = uVar25 + 1) {
                          }
                        }
                        pBVar24 = (BYTE *)((long)puVar28 +
                                          ((uVar25 >> 3 & 0x1fffffff) - (long)puVar31));
                        puVar28 = puVar28 + 1;
                      } while (*puVar36 == uVar45);
                    }
                  }
                  else {
LAB_001fc625:
                    if ((puVar28 < puVar2) && ((int)*puVar36 == (int)*puVar28)) {
                      puVar28 = (ulong *)((long)puVar28 + 4);
                      puVar36 = (ulong *)((long)puVar36 + 4);
                    }
                    if ((puVar28 < puVar3) && ((short)*puVar36 == (short)*puVar28)) {
                      puVar28 = (ulong *)((long)puVar28 + 2);
                      puVar36 = (ulong *)((long)puVar36 + 2);
                    }
                    if (puVar28 < iEnd) {
                      puVar28 = (ulong *)((long)puVar28 + (ulong)((BYTE)*puVar36 == (BYTE)*puVar28))
                      ;
                    }
                    pBVar24 = (BYTE *)((long)puVar28 - (long)puVar31);
                  }
                }
                if ((pBVar30 < pBVar24) &&
                   (local_130 = (ulong)((uVar43 + 2) - uVar44), pBVar30 = pBVar24,
                   (ulong *)((long)puVar31 + (long)pBVar24) == iEnd)) {
                  bVar17 = false;
                }
                else {
                  pBVar24 = pBVar30;
                  if (uVar33 < uVar44) {
                    uVar44 = pUVar14[uVar44 & uVar38 - 1];
                    bVar17 = true;
                  }
                  else {
                    bVar17 = false;
                  }
                }
              } while (((bVar17) && (UVar48 <= uVar44)) &&
                      (iVar42 = iVar42 + -1, pBVar30 = pBVar24, iVar42 != 0));
            }
          }
          else {
            bVar7 = (byte)(ms->cParams).chainLog;
            uVar38 = 1 << (bVar7 & 0x1f);
            pUVar14 = ms->chainTable;
            pBVar29 = (ms->window).base;
            pBVar21 = (ms->window).dictBase;
            uVar33 = 1 << ((byte)(ms->cParams).windowLog & 0x1f);
            UVar10 = (ms->window).lowLimit;
            uVar43 = (uint)((long)puVar31 - (long)pBVar29);
            UVar48 = uVar43 - uVar33;
            if (uVar43 - UVar10 <= uVar33) {
              UVar48 = UVar10;
            }
            if (ms->loadedDictEnd != 0) {
              UVar48 = UVar10;
            }
            uVar33 = uVar43 - uVar38;
            if (uVar43 < uVar38) {
              uVar33 = 0;
            }
            uVar34 = (ms->window).dictLimit;
            iVar42 = 1 << ((byte)(ms->cParams).searchLog & 0x1f);
            pUVar15 = ms->hashTable;
            uVar40 = (ulong)ms->nextToUpdate;
            cVar19 = (char)(ms->cParams).hashLog;
            if (ms->nextToUpdate < uVar43) {
              do {
                uVar44 = (uint)(*(int *)(pBVar29 + uVar40) * -0x61c8864f) >> (0x20U - cVar19 & 0x1f)
                ;
                pUVar14[(uint)uVar40 & ~(-1 << (bVar7 & 0x1f))] = pUVar15[uVar44];
                pUVar15[uVar44] = (uint)uVar40;
                uVar40 = uVar40 + 1;
              } while (uVar40 < ((long)puVar31 - (long)pBVar29 & 0xffffffffU));
            }
            ms->nextToUpdate = uVar43;
            iVar11 = *(int *)puVar31;
            uVar44 = pUVar15[(uint)(iVar11 * -0x61c8864f) >> (-cVar19 & 0x1fU)];
            if (uVar44 < UVar48) goto LAB_001fc7b4;
            local_130 = 999999999;
            pBVar30 = (BYTE *)0x3;
            do {
              if (uVar44 < uVar34) {
                if (*(int *)(pBVar21 + uVar44) == iVar11) {
                  sVar22 = ZSTD_count_2segments
                                     ((BYTE *)((long)local_148 + 5),pBVar21 + (ulong)uVar44 + 4,
                                      (BYTE *)iEnd,pBVar21 + uVar34,pBVar29 + uVar34);
                  pBVar24 = (BYTE *)(sVar22 + 4);
                }
                else {
LAB_001fc9a9:
                  pBVar24 = (BYTE *)0x0;
                }
              }
              else {
                puVar36 = (ulong *)(pBVar29 + uVar44);
                if (pBVar30[(long)puVar36] != *(BYTE *)((long)puVar31 + (long)pBVar30))
                goto LAB_001fc9a9;
                puVar28 = puVar31;
                if (puVar31 < puVar1) {
                  uVar45 = *puVar31 ^ *puVar36;
                  uVar40 = 0;
                  if (uVar45 != 0) {
                    for (; (uVar45 >> uVar40 & 1) == 0; uVar40 = uVar40 + 1) {
                    }
                  }
                  pBVar24 = (BYTE *)(uVar40 >> 3 & 0x1fffffff);
                  puVar28 = (ulong *)((long)local_148 + 9);
                  if (*puVar36 == *puVar31) {
                    do {
                      puVar36 = puVar36 + 1;
                      if (puVar1 <= puVar28) goto LAB_001fc9b0;
                      uVar40 = *puVar28;
                      uVar25 = uVar40 ^ *puVar36;
                      uVar45 = 0;
                      if (uVar25 != 0) {
                        for (; (uVar25 >> uVar45 & 1) == 0; uVar45 = uVar45 + 1) {
                        }
                      }
                      pBVar24 = (BYTE *)((long)puVar28 +
                                        ((uVar45 >> 3 & 0x1fffffff) - (long)puVar31));
                      puVar28 = puVar28 + 1;
                    } while (*puVar36 == uVar40);
                  }
                }
                else {
LAB_001fc9b0:
                  if ((puVar28 < puVar2) && ((int)*puVar36 == (int)*puVar28)) {
                    puVar28 = (ulong *)((long)puVar28 + 4);
                    puVar36 = (ulong *)((long)puVar36 + 4);
                  }
                  if ((puVar28 < puVar3) && ((short)*puVar36 == (short)*puVar28)) {
                    puVar28 = (ulong *)((long)puVar28 + 2);
                    puVar36 = (ulong *)((long)puVar36 + 2);
                  }
                  if (puVar28 < iEnd) {
                    puVar28 = (ulong *)((long)puVar28 + (ulong)((BYTE)*puVar36 == (BYTE)*puVar28));
                  }
                  pBVar24 = (BYTE *)((long)puVar28 - (long)puVar31);
                }
              }
              if ((pBVar30 < pBVar24) &&
                 (local_130 = (ulong)((uVar43 + 2) - uVar44), pBVar30 = pBVar24,
                 (ulong *)((long)puVar31 + (long)pBVar24) == iEnd)) {
                bVar17 = false;
              }
              else {
                pBVar24 = pBVar30;
                if (uVar33 < uVar44) {
                  uVar44 = pUVar14[uVar44 & uVar38 - 1];
                  bVar17 = true;
                }
                else {
                  bVar17 = false;
                }
              }
            } while (((bVar17) && (UVar48 <= uVar44)) &&
                    (iVar42 = iVar42 + -1, pBVar30 = pBVar24, iVar42 != 0));
          }
          bVar17 = true;
          if ((BYTE *)0x3 < pBVar24) {
            uVar33 = (int)local_100 + 1;
            uVar43 = 0x1f;
            if (uVar33 != 0) {
              for (; uVar33 >> uVar43 == 0; uVar43 = uVar43 - 1) {
              }
            }
            uVar33 = (int)local_130 + 1;
            iVar42 = 0x1f;
            if (uVar33 != 0) {
              for (; uVar33 >> iVar42 == 0; iVar42 = iVar42 + -1) {
              }
            }
            if ((int)((uVar43 ^ 0x1f) + (int)local_118 * 4 + -0x1b) < (int)pBVar24 * 4 - iVar42) {
              bVar17 = false;
              puVar35 = puVar31;
              local_100 = local_130;
              local_118 = pBVar24;
            }
          }
          local_148 = puVar31;
        } while (!bVar17);
        if (local_100 == 0) {
          UVar48 = 1;
          UVar10 = UVar46;
        }
        else {
          pBVar30 = (BYTE *)((long)puVar35 + (2 - (long)(pBVar12 + local_100)));
          pBVar21 = iStart;
          pBVar29 = pBVar12;
          if ((uint)pBVar30 < uVar8) {
            pBVar21 = pBVar13 + uVar9;
            pBVar29 = pBVar13;
          }
          if ((src < puVar35) && (uVar40 = (ulong)pBVar30 & 0xffffffff, pBVar21 < pBVar29 + uVar40))
          {
            pBVar29 = pBVar29 + uVar40;
            do {
              pBVar29 = pBVar29 + -1;
              puVar31 = (ulong *)((long)puVar35 + -1);
              if ((*(BYTE *)puVar31 != *pBVar29) ||
                 (local_118 = local_118 + 1, puVar35 = puVar31, puVar31 <= src)) break;
            } while (pBVar21 < pBVar29);
          }
          UVar48 = (int)local_100 + 1;
          UVar10 = (int)local_100 - 2;
          UVar39 = UVar46;
        }
        UVar46 = UVar10;
        uVar40 = (long)puVar35 - (long)src;
        if (puVar4 < puVar35) {
          puVar36 = (ulong *)seqStore->lit;
          puVar31 = puVar36;
          puVar28 = (ulong *)src;
          if (src <= puVar4) {
            puVar31 = (ulong *)((long)puVar36 + ((long)puVar4 - (long)src));
            uVar45 = *(ulong *)((long)src + 8);
            *puVar36 = *src;
            puVar36[1] = uVar45;
            puVar28 = puVar4;
            if (0x10 < (long)puVar4 - (long)src) {
              lVar37 = 0x10;
              do {
                uVar18 = *(undefined8 *)((BYTE *)((long)src + lVar37) + 8);
                puVar5 = (undefined8 *)((long)puVar36 + lVar37);
                *puVar5 = *(undefined8 *)((long)src + lVar37);
                puVar5[1] = uVar18;
                pBVar29 = (BYTE *)((long)src + lVar37 + 0x10);
                uVar18 = *(undefined8 *)(pBVar29 + 8);
                puVar5[2] = *(undefined8 *)pBVar29;
                puVar5[3] = uVar18;
                lVar37 = lVar37 + 0x20;
              } while (puVar5 + 4 < puVar31);
            }
          }
          if (puVar28 < puVar35) {
            lVar37 = 0;
            do {
              *(BYTE *)((long)puVar31 + lVar37) = *(BYTE *)((long)puVar28 + lVar37);
              lVar37 = lVar37 + 1;
            } while ((long)puVar35 - (long)puVar28 != lVar37);
          }
        }
        else {
          puVar31 = (ulong *)seqStore->lit;
          uVar45 = *(ulong *)((long)src + 8);
          *puVar31 = *src;
          puVar31[1] = uVar45;
          if (0x10 < uVar40) {
            pBVar29 = seqStore->lit;
            uVar45 = *(ulong *)((long)src + 0x18);
            *(ulong *)(pBVar29 + 0x10) = *(ulong *)((long)src + 0x10);
            *(ulong *)(pBVar29 + 0x18) = uVar45;
            if (0x20 < (long)uVar40) {
              lVar37 = 0;
              do {
                pBVar30 = (BYTE *)((long)src + lVar37 + 0x20);
                uVar18 = *(undefined8 *)(pBVar30 + 8);
                pBVar21 = pBVar29 + lVar37 + 0x20;
                *(undefined8 *)pBVar21 = *(undefined8 *)pBVar30;
                *(undefined8 *)(pBVar21 + 8) = uVar18;
                pBVar30 = (BYTE *)((long)src + lVar37 + 0x30);
                uVar18 = *(undefined8 *)(pBVar30 + 8);
                *(undefined8 *)(pBVar21 + 0x10) = *(undefined8 *)pBVar30;
                *(undefined8 *)(pBVar21 + 0x18) = uVar18;
                lVar37 = lVar37 + 0x20;
              } while (pBVar21 + 0x20 < pBVar29 + uVar40);
            }
          }
        }
        seqStore->lit = seqStore->lit + uVar40;
        if (0xffff < uVar40) {
          seqStore->longLengthType = ZSTD_llt_literalLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)seqStore->sequences - (long)seqStore->sequencesStart) >> 3);
        }
        psVar16 = seqStore->sequences;
        psVar16->litLength = (U16)uVar40;
        psVar16->offset = UVar48;
        if ((BYTE *)0xffff < local_118 + -3) {
          seqStore->longLengthType = ZSTD_llt_matchLength;
          seqStore->longLengthPos =
               (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
        }
        psVar16->matchLength = (U16)(local_118 + -3);
        seqStore->sequences = psVar16 + 1;
        local_148 = (ulong *)((long)puVar35 + (long)local_118);
        src = local_148;
        do {
          if (puVar6 < local_148) break;
          iVar47 = (int)local_148 - (int)pBVar12;
          UVar10 = (ms->window).lowLimit;
          UVar48 = iVar47 - uVar32;
          if (iVar47 - UVar10 <= uVar32) {
            UVar48 = UVar10;
          }
          if (ms->loadedDictEnd != 0) {
            UVar48 = UVar10;
          }
          uVar43 = iVar47 - UVar39;
          pBVar29 = pBVar12;
          if (uVar43 < uVar8) {
            pBVar29 = pBVar13;
          }
          bVar17 = false;
          UVar10 = UVar39;
          if ((2 < iVar20 - uVar43) && (UVar39 < iVar47 - UVar48)) {
            if ((int)*local_148 == *(int *)(pBVar29 + uVar43)) {
              puVar35 = iEnd;
              if (uVar43 < uVar8) {
                puVar35 = puVar27;
              }
              sVar22 = ZSTD_count_2segments
                                 ((BYTE *)((long)local_148 + 4),
                                  (BYTE *)((long)(pBVar29 + uVar43) + 4),(BYTE *)iEnd,
                                  (BYTE *)puVar35,iStart);
              if (src <= puVar4) {
                puVar35 = (ulong *)seqStore->lit;
                uVar40 = *(ulong *)((long)src + 8);
                *puVar35 = *src;
                puVar35[1] = uVar40;
              }
              psVar16 = seqStore->sequences;
              psVar16->litLength = 0;
              psVar16->offset = 1;
              if (0xffff < sVar22 + 1) {
                seqStore->longLengthType = ZSTD_llt_matchLength;
                seqStore->longLengthPos =
                     (U32)((ulong)((long)psVar16 - (long)seqStore->sequencesStart) >> 3);
              }
              psVar16->matchLength = (U16)(sVar22 + 1);
              seqStore->sequences = psVar16 + 1;
              local_148 = (ulong *)((long)local_148 + sVar22 + 4);
              bVar17 = true;
              src = local_148;
              UVar10 = UVar46;
              UVar46 = UVar39;
            }
            else {
              bVar17 = false;
            }
          }
          UVar39 = UVar10;
        } while (bVar17);
      }
    } while (local_148 < puVar6);
  }
  *rep = UVar46;
  rep[1] = UVar39;
  return (long)iEnd - (long)src;
}

Assistant:

size_t ZSTD_compressBlock_lazy_extDict(
        ZSTD_matchState_t* ms, seqStore_t* seqStore, U32 rep[ZSTD_REP_NUM],
        void const* src, size_t srcSize)

{
    return ZSTD_compressBlock_lazy_extDict_generic(ms, seqStore, rep, src, srcSize, search_hashChain, 1);
}